

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O1

Locale * __thiscall
icu_63::RuleBasedNumberFormat::getRuleSetDisplayNameLocale
          (Locale *__return_storage_ptr__,RuleBasedNumberFormat *this,int32_t index,
          UErrorCode *status)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 extraout_var;
  char *target;
  UnicodeString name;
  char buffer [64];
  ConstChar16Ptr local_c0;
  char16_t *local_b8;
  UnicodeString local_a8;
  char local_68 [72];
  
  if (U_ZERO_ERROR < *status) {
    Locale::Locale(__return_storage_ptr__,"",(char *)0x0,(char *)0x0,(char *)0x0);
    return __return_storage_ptr__;
  }
  if ((index < 0 || this->localizations == (LocalizationInfo *)0x0) ||
     (iVar1 = (*this->localizations->_vptr_LocalizationInfo[5])(), iVar1 <= index)) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    Locale::Locale(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  iVar1 = (*this->localizations->_vptr_LocalizationInfo[6])(this->localizations,(ulong)(uint)index);
  local_c0.p_ = (char16_t *)CONCAT44(extraout_var,iVar1);
  UnicodeString::UnicodeString(&local_a8,'\x01',&local_c0,-1);
  local_b8 = local_c0.p_;
  uVar2 = local_a8.fUnion.fFields.fLength;
  if (-1 < local_a8.fUnion.fStackFields.fLengthAndFlags) {
    uVar2 = (int)local_a8.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  if ((int)uVar2 < 0x40) {
    target = local_68;
  }
  else {
    target = (char *)uprv_malloc_63((ulong)(uVar2 + 1));
    if (target == (char *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      Locale::Locale(__return_storage_ptr__,"",(char *)0x0,(char *)0x0,(char *)0x0);
      goto LAB_0021e101;
    }
  }
  if (-1 < local_a8.fUnion.fStackFields.fLengthAndFlags) {
    local_a8.fUnion.fFields.fLength = (int)local_a8.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::extract(&local_a8,0,local_a8.fUnion.fFields.fLength,target,uVar2 + 1,kInvariant);
  Locale::Locale(__return_storage_ptr__,target,(char *)0x0,(char *)0x0,(char *)0x0);
  if (target != local_68) {
    uprv_free_63(target);
  }
LAB_0021e101:
  UnicodeString::~UnicodeString(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

Locale 
RuleBasedNumberFormat::getRuleSetDisplayNameLocale(int32_t index, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return Locale("");
    }
    if (localizations && index >= 0 && index < localizations->getNumberOfDisplayLocales()) {
        UnicodeString name(TRUE, localizations->getLocaleName(index), -1);
        char buffer[64];
        int32_t cap = name.length() + 1;
        char* bp = buffer;
        if (cap > 64) {
            bp = (char *)uprv_malloc(cap);
            if (bp == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                return Locale("");
            }
        }
        name.extract(0, name.length(), bp, cap, UnicodeString::kInvariant);
        Locale retLocale(bp);
        if (bp != buffer) {
            uprv_free(bp);
        }
        return retLocale;
    }
    status = U_ILLEGAL_ARGUMENT_ERROR;
    Locale retLocale;
    return retLocale;
}